

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::InnerProduct_x86_avx512::create_pipeline(InnerProduct_x86_avx512 *this,Option *opt)

{
  Mat *this_00;
  Mat *this_01;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  size_t sVar5;
  int *piVar6;
  Allocator *pAVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  int iVar20;
  int iVar21;
  int iVar22;
  uint _w;
  Layer *pLVar23;
  long lVar24;
  byte bVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  undefined4 *puVar32;
  ulong uVar33;
  long lVar34;
  long lVar35;
  void *pvVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  long lVar40;
  void *pvVar41;
  uint uVar42;
  uint uVar43;
  long lVar44;
  long lVar45;
  undefined1 (*pauVar46) [64];
  undefined4 *puVar47;
  uint uVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  void *pvVar55;
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  ParamDict pd;
  void *local_198;
  void *local_190;
  void *local_188;
  void *local_180;
  void *local_178;
  void *local_168;
  void *local_160;
  void *local_158;
  void *local_150;
  void *local_148;
  void *local_140;
  void *local_138;
  long local_120;
  uint local_108;
  Mat local_e8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  void *local_68;
  ulong local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  pLVar23 = create_layer_cpu(0xe);
  this->flatten = pLVar23;
  ParamDict::ParamDict((ParamDict *)&local_e8);
  (*this->flatten->_vptr_Layer[2])(this->flatten,&local_e8);
  (*this->flatten->_vptr_Layer[4])(this->flatten,opt);
  ParamDict::~ParamDict((ParamDict *)&local_e8);
  if ((opt->use_int8_inference == true) && ((this->super_InnerProduct).weight_data.elemsize == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  iVar22 = cpu_support_x86_f16c();
  if ((iVar22 != 0) && (opt->use_fp16_storage == true)) {
    create_pipeline_fp16s(this,opt);
    return 0;
  }
  uVar48 = (this->super_InnerProduct).num_output;
  uVar39 = (ulong)uVar48;
  _w = (this->super_InnerProduct).weight_data_size / (int)uVar48;
  bVar25 = 1;
  if (opt->use_packing_layout == true) {
    if ((uVar48 & 0xf) == 0) {
      bVar25 = 0x10;
    }
    else if ((uVar48 & 7) == 0) {
      bVar25 = 8;
    }
    else {
      bVar25 = ((uVar48 & 3) == 0) * '\x03' + 1;
    }
  }
  this_00 = &(this->super_InnerProduct).weight_data;
  this_01 = &this->weight_data_tm;
  if (7 < bVar25) {
    if (bVar25 != 8) {
      if (bVar25 == 0x10) {
        Mat::reshape(&local_e8,this_00,_w,uVar48,(Allocator *)0x0);
        uVar43 = uVar48 + 0xf;
        if (-1 < (int)uVar48) {
          uVar43 = uVar48;
        }
        Mat::create(this_01,_w,(int)uVar43 >> 4,0x40,0x10,(Allocator *)0x0);
        if (0xf < (int)uVar48) {
          lVar26 = 1;
          lVar34 = 2;
          lVar44 = 0xf;
          local_70 = 9;
          local_78 = 8;
          local_80 = 7;
          local_88 = 6;
          local_90 = 5;
          local_98 = 4;
          local_a0 = 3;
          lVar52 = 10;
          uVar38 = 0;
          lVar24 = 0xe;
          lVar27 = 0xb;
          lVar28 = 0xd;
          lVar29 = 0xc;
          do {
            local_48 = lVar29;
            local_40 = lVar28;
            local_50 = lVar27;
            local_38 = lVar24;
            local_60 = uVar38;
            local_58 = lVar52;
            pauVar46 = (undefined1 (*) [64])
                       ((long)(this->weight_data_tm).w * (local_60 >> 4) *
                        (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
            lVar52 = (long)local_e8.w;
            if ((int)_w < 0x10) {
              lVar52 = local_e8.elemsize * lVar52;
              local_178 = (void *)(lVar52 * local_60 + (long)local_e8.data);
              local_198 = (void *)((local_60 | 1) * lVar52 + (long)local_e8.data);
              local_180 = (void *)((local_60 | 2) * lVar52 + (long)local_e8.data);
              local_188 = (void *)((local_60 | 3) * lVar52 + (long)local_e8.data);
              local_168 = (void *)((local_60 | 4) * lVar52 + (long)local_e8.data);
              local_190 = (void *)((local_60 | 5) * lVar52 + (long)local_e8.data);
              pvVar55 = (void *)((local_60 | 6) * lVar52 + (long)local_e8.data);
              local_150 = (void *)((local_60 | 7) * lVar52 + (long)local_e8.data);
              pvVar36 = (void *)((local_60 | 8) * lVar52 + (long)local_e8.data);
              pvVar41 = (void *)((local_60 | 9) * lVar52 + (long)local_e8.data);
              local_160 = (void *)((local_60 | 10) * lVar52 + (long)local_e8.data);
              local_138 = (void *)((local_60 | 0xb) * lVar52 + (long)local_e8.data);
              local_158 = (void *)((local_60 | 0xc) * lVar52 + (long)local_e8.data);
              local_140 = (void *)((local_60 | 0xd) * lVar52 + (long)local_e8.data);
              local_148 = (void *)((local_60 | 0xe) * lVar52 + (long)local_e8.data);
              local_68 = (void *)(lVar52 * (local_60 | 0xf) + (long)local_e8.data);
              uVar48 = 0;
            }
            else {
              lVar50 = local_e8.elemsize * local_60 * lVar52;
              lVar49 = local_e8.elemsize * lVar26 * lVar52;
              lVar27 = local_e8.elemsize * lVar34 * lVar52;
              lVar28 = local_e8.elemsize * lVar44 * lVar52;
              lVar40 = local_e8.elemsize * local_38 * lVar52;
              lVar51 = local_e8.elemsize * local_40 * lVar52;
              lVar53 = local_e8.elemsize * local_48 * lVar52;
              lVar45 = local_e8.elemsize * local_50 * lVar52;
              lVar29 = local_e8.elemsize * local_58 * lVar52;
              lVar30 = local_e8.elemsize * local_70 * lVar52;
              lVar35 = local_e8.elemsize * local_78 * lVar52;
              lVar31 = local_e8.elemsize * local_80 * lVar52;
              lVar54 = local_e8.elemsize * local_88 * lVar52;
              lVar24 = local_e8.elemsize * local_90 * lVar52;
              lVar37 = local_e8.elemsize * local_98 * lVar52;
              lVar52 = local_e8.elemsize * local_a0 * lVar52;
              iVar22 = 0xf;
              local_188 = local_e8.data;
              do {
                auVar68 = *(undefined1 (*) [64])((long)local_188 + lVar50);
                auVar69 = *(undefined1 (*) [64])((long)local_188 + lVar49);
                auVar70 = *(undefined1 (*) [64])((long)local_188 + lVar27);
                auVar71 = *(undefined1 (*) [64])((long)local_188 + lVar52);
                auVar72 = *(undefined1 (*) [64])((long)local_188 + lVar37);
                auVar73 = *(undefined1 (*) [64])((long)local_188 + lVar24);
                auVar74 = *(undefined1 (*) [64])((long)local_188 + lVar54);
                auVar75 = *(undefined1 (*) [64])((long)local_188 + lVar31);
                auVar76 = *(undefined1 (*) [64])((long)local_188 + lVar35);
                auVar77 = *(undefined1 (*) [64])((long)local_188 + lVar30);
                auVar78 = *(undefined1 (*) [64])((long)local_188 + lVar29);
                auVar79 = *(undefined1 (*) [64])((long)local_188 + lVar45);
                auVar80 = *(undefined1 (*) [64])((long)local_188 + lVar53);
                auVar81 = *(undefined1 (*) [64])((long)local_188 + lVar51);
                auVar82 = *(undefined1 (*) [64])((long)local_188 + lVar40);
                auVar83 = *(undefined1 (*) [64])((long)local_188 + lVar28);
                auVar67 = vunpcklps_avx512f(auVar68,auVar69);
                auVar68 = vunpckhps_avx512f(auVar68,auVar69);
                auVar69 = vunpcklps_avx512f(auVar70,auVar71);
                auVar70 = vunpckhps_avx512f(auVar70,auVar71);
                auVar71 = vunpcklps_avx512f(auVar72,auVar73);
                auVar72 = vunpckhps_avx512f(auVar72,auVar73);
                auVar73 = vunpcklps_avx512f(auVar74,auVar75);
                auVar74 = vunpckhps_avx512f(auVar74,auVar75);
                auVar75 = vunpcklps_avx512f(auVar76,auVar77);
                auVar76 = vunpckhps_avx512f(auVar76,auVar77);
                auVar77 = vunpcklps_avx512f(auVar78,auVar79);
                auVar78 = vunpckhps_avx512f(auVar78,auVar79);
                auVar79 = vunpcklps_avx512f(auVar80,auVar81);
                auVar80 = vunpckhps_avx512f(auVar80,auVar81);
                auVar81 = vunpcklps_avx512f(auVar82,auVar83);
                auVar82 = vunpckhps_avx512f(auVar82,auVar83);
                auVar83 = vunpcklpd_avx512f(auVar67,auVar69);
                auVar69 = vunpckhpd_avx512f(auVar67,auVar69);
                auVar67 = vunpcklpd_avx512f(auVar68,auVar70);
                auVar68 = vunpckhpd_avx512f(auVar68,auVar70);
                auVar70 = vunpcklpd_avx512f(auVar71,auVar73);
                auVar71 = vunpckhpd_avx512f(auVar71,auVar73);
                auVar73 = vunpcklpd_avx512f(auVar72,auVar74);
                auVar72 = vunpckhpd_avx512f(auVar72,auVar74);
                auVar74 = vunpcklpd_avx512f(auVar75,auVar77);
                auVar75 = vunpckhpd_avx512f(auVar75,auVar77);
                auVar77 = vunpcklpd_avx512f(auVar76,auVar78);
                auVar76 = vunpckhpd_avx512f(auVar76,auVar78);
                auVar78 = vunpcklpd_avx512f(auVar79,auVar81);
                auVar79 = vunpckhpd_avx512f(auVar79,auVar81);
                auVar81 = vunpcklpd_avx512f(auVar80,auVar82);
                auVar80 = vunpckhpd_avx512f(auVar80,auVar82);
                auVar82 = vshuff64x2_avx512f(auVar83,auVar70,0x88);
                auVar84 = vshuff64x2_avx512f(auVar74,auVar78,0x88);
                auVar85 = vshuff64x2_avx512f(auVar69,auVar71,0x88);
                auVar86 = vshuff64x2_avx512f(auVar75,auVar79,0x88);
                auVar87 = vshuff64x2_avx512f(auVar67,auVar73,0x88);
                auVar88 = vshuff64x2_avx512f(auVar77,auVar81,0x88);
                auVar89 = vshuff64x2_avx512f(auVar68,auVar72,0x88);
                auVar90 = vshuff64x2_avx512f(auVar76,auVar80,0x88);
                auVar70 = vshuff64x2_avx512f(auVar83,auVar70,0xdd);
                auVar74 = vshuff64x2_avx512f(auVar74,auVar78,0xdd);
                auVar69 = vshuff64x2_avx512f(auVar69,auVar71,0xdd);
                auVar71 = vshuff64x2_avx512f(auVar75,auVar79,0xdd);
                auVar73 = vshuff64x2_avx512f(auVar67,auVar73,0xdd);
                auVar75 = vshuff64x2_avx512f(auVar77,auVar81,0xdd);
                auVar68 = vshuff64x2_avx512f(auVar68,auVar72,0xdd);
                auVar72 = vshuff64x2_avx512f(auVar76,auVar80,0xdd);
                auVar76 = vshuff64x2_avx512f(auVar82,auVar84,0x88);
                auVar77 = vshuff64x2_avx512f(auVar85,auVar86,0x88);
                auVar78 = vshuff64x2_avx512f(auVar87,auVar88,0x88);
                auVar79 = vshuff64x2_avx512f(auVar89,auVar90,0x88);
                auVar80 = vshuff64x2_avx512f(auVar70,auVar74,0x88);
                auVar81 = vshuff64x2_avx512f(auVar69,auVar71,0x88);
                auVar83 = vshuff64x2_avx512f(auVar73,auVar75,0x88);
                auVar67 = vshuff64x2_avx512f(auVar68,auVar72,0x88);
                auVar82 = vshuff64x2_avx512f(auVar82,auVar84,0xdd);
                auVar84 = vshuff64x2_avx512f(auVar85,auVar86,0xdd);
                auVar85 = vshuff64x2_avx512f(auVar87,auVar88,0xdd);
                auVar86 = vshuff64x2_avx512f(auVar89,auVar90,0xdd);
                auVar70 = vshuff64x2_avx512f(auVar70,auVar74,0xdd);
                auVar69 = vshuff64x2_avx512f(auVar69,auVar71,0xdd);
                auVar71 = vshuff64x2_avx512f(auVar73,auVar75,0xdd);
                auVar68 = vshuff64x2_avx512f(auVar68,auVar72,0xdd);
                *pauVar46 = auVar76;
                pauVar46[1] = auVar77;
                pauVar46[2] = auVar78;
                pauVar46[3] = auVar79;
                pauVar46[4] = auVar80;
                pauVar46[5] = auVar81;
                pauVar46[6] = auVar83;
                pauVar46[7] = auVar67;
                pauVar46[8] = auVar82;
                pauVar46[9] = auVar84;
                pauVar46[10] = auVar85;
                pauVar46[0xb] = auVar86;
                pauVar46[0xc] = auVar70;
                pauVar46[0xd] = auVar69;
                pauVar46[0xe] = auVar71;
                pauVar46[0xf] = auVar68;
                pauVar46 = pauVar46 + 0x10;
                local_188 = (void *)((long)local_188 + 0x40);
                iVar22 = iVar22 + 0x10;
              } while (iVar22 < (int)_w);
              local_178 = (void *)(lVar50 + (long)local_188);
              local_198 = (void *)(lVar49 + (long)local_188);
              local_180 = (void *)(lVar27 + (long)local_188);
              local_68 = (void *)(lVar28 + (long)local_188);
              local_148 = (void *)(lVar40 + (long)local_188);
              local_140 = (void *)(lVar51 + (long)local_188);
              local_158 = (void *)(lVar53 + (long)local_188);
              local_138 = (void *)(lVar45 + (long)local_188);
              local_160 = (void *)(lVar29 + (long)local_188);
              pvVar41 = (void *)(lVar30 + (long)local_188);
              pvVar36 = (void *)(lVar35 + (long)local_188);
              local_150 = (void *)(lVar31 + (long)local_188);
              pvVar55 = (void *)(lVar54 + (long)local_188);
              local_190 = (void *)(lVar24 + (long)local_188);
              local_168 = (void *)(lVar37 + (long)local_188);
              local_188 = (void *)(lVar52 + (long)local_188);
              uVar48 = _w & 0xfffffff0;
            }
            if ((int)(uVar48 | 7) < (int)_w) {
              lVar52 = 0;
              uVar43 = uVar48;
              do {
                auVar56 = vunpcklps_avx512vl(*(undefined1 (*) [32])((long)local_178 + lVar52),
                                             *(undefined1 (*) [32])((long)local_198 + lVar52));
                auVar8 = vunpckhps_avx(*(undefined1 (*) [32])((long)local_178 + lVar52),
                                       *(undefined1 (*) [32])((long)local_198 + lVar52));
                auVar18 = vunpcklps_avx(*(undefined1 (*) [32])((long)local_180 + lVar52),
                                        *(undefined1 (*) [32])((long)local_188 + lVar52));
                auVar9 = vunpckhps_avx(*(undefined1 (*) [32])((long)local_180 + lVar52),
                                       *(undefined1 (*) [32])((long)local_188 + lVar52));
                auVar66 = vunpcklps_avx(*(undefined1 (*) [32])((long)local_168 + lVar52),
                                        *(undefined1 (*) [32])((long)local_190 + lVar52));
                auVar10 = vunpckhps_avx(*(undefined1 (*) [32])((long)local_168 + lVar52),
                                        *(undefined1 (*) [32])((long)local_190 + lVar52));
                auVar91 = vunpcklps_avx(*(undefined1 (*) [32])((long)pvVar55 + lVar52),
                                        *(undefined1 (*) [32])((long)local_150 + lVar52));
                auVar11 = vunpckhps_avx(*(undefined1 (*) [32])((long)pvVar55 + lVar52),
                                        *(undefined1 (*) [32])((long)local_150 + lVar52));
                auVar92 = vunpcklps_avx(*(undefined1 (*) [32])((long)pvVar36 + lVar52),
                                        *(undefined1 (*) [32])((long)pvVar41 + lVar52));
                auVar12 = vunpckhps_avx(*(undefined1 (*) [32])((long)pvVar36 + lVar52),
                                        *(undefined1 (*) [32])((long)pvVar41 + lVar52));
                auVar93 = vunpcklps_avx(*(undefined1 (*) [32])((long)local_160 + lVar52),
                                        *(undefined1 (*) [32])((long)local_138 + lVar52));
                auVar13 = vunpckhps_avx(*(undefined1 (*) [32])((long)local_160 + lVar52),
                                        *(undefined1 (*) [32])((long)local_138 + lVar52));
                auVar19 = vunpcklps_avx(*(undefined1 (*) [32])((long)local_158 + lVar52),
                                        *(undefined1 (*) [32])((long)local_140 + lVar52));
                auVar14 = vunpckhps_avx(*(undefined1 (*) [32])((long)local_158 + lVar52),
                                        *(undefined1 (*) [32])((long)local_140 + lVar52));
                auVar59 = vunpcklps_avx(*(undefined1 (*) [32])((long)local_148 + lVar52),
                                        *(undefined1 (*) [32])((long)local_68 + lVar52));
                auVar15 = vunpckhps_avx(*(undefined1 (*) [32])((long)local_148 + lVar52),
                                        *(undefined1 (*) [32])((long)local_68 + lVar52));
                auVar57 = vunpcklpd_avx512vl(auVar56,auVar18);
                auVar56 = vunpckhpd_avx512vl(auVar56,auVar18);
                auVar58 = vunpcklpd_avx512vl(auVar8,auVar9);
                auVar8 = vunpckhpd_avx(auVar8,auVar9);
                auVar18 = vunpcklpd_avx(auVar66,auVar91);
                auVar9 = vunpckhpd_avx(auVar66,auVar91);
                auVar66 = vunpcklpd_avx(auVar10,auVar11);
                auVar10 = vunpckhpd_avx(auVar10,auVar11);
                auVar91 = vunpcklpd_avx(auVar92,auVar93);
                auVar11 = vunpckhpd_avx(auVar92,auVar93);
                auVar92 = vunpcklpd_avx(auVar12,auVar13);
                auVar12 = vunpckhpd_avx(auVar12,auVar13);
                auVar93 = vunpcklpd_avx(auVar19,auVar59);
                auVar13 = vunpckhpd_avx(auVar19,auVar59);
                auVar19 = vunpcklpd_avx(auVar14,auVar15);
                auVar14 = vunpckhpd_avx(auVar14,auVar15);
                auVar94._16_16_ = auVar18._0_16_;
                auVar94._0_16_ = auVar57._0_16_;
                auVar59 = vinsertf32x4_avx512vl(auVar91,auVar93._0_16_,1);
                auVar60 = vinsertf32x4_avx512vl(auVar56,auVar9._0_16_,1);
                auVar61 = vinsertf32x4_avx512vl(auVar11,auVar13._0_16_,1);
                auVar62 = vinsertf32x4_avx512vl(auVar58,auVar66._0_16_,1);
                auVar63 = vinsertf32x4_avx512vl(auVar92,auVar19._0_16_,1);
                auVar64 = vinsertf32x4_avx512vl(auVar8,auVar10._0_16_,1);
                auVar65 = vinsertf32x4_avx512vl(auVar12,auVar14._0_16_,1);
                auVar15 = vperm2f128_avx(auVar57,auVar18,0x31);
                auVar18 = vperm2f128_avx(auVar91,auVar93,0x31);
                auVar9 = vperm2f128_avx(auVar56,auVar9,0x31);
                auVar11 = vperm2f128_avx(auVar11,auVar13,0x31);
                auVar66 = vshuff64x2_avx512vl(auVar58,auVar66,3);
                auVar13 = vperm2f128_avx(auVar92,auVar19,0x31);
                auVar8 = vperm2f128_avx(auVar8,auVar10,0x31);
                auVar10 = vperm2f128_avx(auVar12,auVar14,0x31);
                *(undefined1 (*) [32])*pauVar46 = auVar94;
                *(undefined1 (*) [32])((long)*pauVar46 + 0x20) = auVar59;
                *(undefined1 (*) [32])pauVar46[1] = auVar60;
                *(undefined1 (*) [32])(pauVar46[1] + 0x20) = auVar61;
                *(undefined1 (*) [32])pauVar46[2] = auVar62;
                *(undefined1 (*) [32])(pauVar46[2] + 0x20) = auVar63;
                *(undefined1 (*) [32])pauVar46[3] = auVar64;
                *(undefined1 (*) [32])(pauVar46[3] + 0x20) = auVar65;
                *(undefined1 (*) [32])pauVar46[4] = auVar15;
                *(undefined1 (*) [32])(pauVar46[4] + 0x20) = auVar18;
                *(undefined1 (*) [32])pauVar46[5] = auVar9;
                *(undefined1 (*) [32])(pauVar46[5] + 0x20) = auVar11;
                *(undefined1 (*) [32])pauVar46[6] = auVar66;
                *(undefined1 (*) [32])(pauVar46[6] + 0x20) = auVar13;
                *(undefined1 (*) [32])pauVar46[7] = auVar8;
                *(undefined1 (*) [32])(pauVar46[7] + 0x20) = auVar10;
                pauVar46 = pauVar46 + 8;
                uVar48 = uVar43 + 8;
                lVar52 = lVar52 + 0x20;
                iVar22 = uVar43 + 0xf;
                uVar43 = uVar48;
              } while (iVar22 < (int)_w);
              local_178 = (void *)((long)local_178 + lVar52);
              local_198 = (void *)((long)local_198 + lVar52);
              local_180 = (void *)((long)local_180 + lVar52);
              local_68 = (void *)((long)local_68 + lVar52);
              local_148 = (void *)((long)local_148 + lVar52);
              local_140 = (void *)((long)local_140 + lVar52);
              local_158 = (void *)((long)local_158 + lVar52);
              local_138 = (void *)((long)local_138 + lVar52);
              local_160 = (void *)((long)local_160 + lVar52);
              pvVar41 = (void *)((long)pvVar41 + lVar52);
              pvVar36 = (void *)((long)pvVar36 + lVar52);
              local_150 = (void *)((long)local_150 + lVar52);
              pvVar55 = (void *)((long)pvVar55 + lVar52);
              local_190 = (void *)((long)local_190 + lVar52);
              local_168 = (void *)((long)local_168 + lVar52);
              local_188 = (void *)((long)local_188 + lVar52);
            }
            if ((int)uVar48 < (int)_w) {
              lVar52 = 0;
              do {
                *(undefined4 *)*pauVar46 = *(undefined4 *)((long)local_178 + lVar52 * 4);
                *(undefined4 *)((long)*pauVar46 + 4) = *(undefined4 *)((long)local_198 + lVar52 * 4)
                ;
                *(undefined4 *)((long)*pauVar46 + 8) = *(undefined4 *)((long)local_180 + lVar52 * 4)
                ;
                *(undefined4 *)((long)*pauVar46 + 0xc) =
                     *(undefined4 *)((long)local_188 + lVar52 * 4);
                *(undefined4 *)((long)*pauVar46 + 0x10) =
                     *(undefined4 *)((long)local_168 + lVar52 * 4);
                *(undefined4 *)((long)*pauVar46 + 0x14) =
                     *(undefined4 *)((long)local_190 + lVar52 * 4);
                *(undefined4 *)((long)*pauVar46 + 0x18) =
                     *(undefined4 *)((long)pvVar55 + lVar52 * 4);
                *(undefined4 *)((long)*pauVar46 + 0x1c) =
                     *(undefined4 *)((long)local_150 + lVar52 * 4);
                *(undefined4 *)((long)*pauVar46 + 0x20) =
                     *(undefined4 *)((long)pvVar36 + lVar52 * 4);
                *(undefined4 *)((long)*pauVar46 + 0x24) =
                     *(undefined4 *)((long)pvVar41 + lVar52 * 4);
                *(undefined4 *)((long)*pauVar46 + 0x28) =
                     *(undefined4 *)((long)local_160 + lVar52 * 4);
                *(undefined4 *)((long)*pauVar46 + 0x2c) =
                     *(undefined4 *)((long)local_138 + lVar52 * 4);
                *(undefined4 *)((long)*pauVar46 + 0x30) =
                     *(undefined4 *)((long)local_158 + lVar52 * 4);
                *(undefined4 *)((long)*pauVar46 + 0x34) =
                     *(undefined4 *)((long)local_140 + lVar52 * 4);
                *(undefined4 *)((long)*pauVar46 + 0x38) =
                     *(undefined4 *)((long)local_148 + lVar52 * 4);
                *(undefined4 *)((long)*pauVar46 + 0x3c) =
                     *(undefined4 *)((long)local_68 + lVar52 * 4);
                pauVar46 = pauVar46 + 1;
                lVar52 = lVar52 + 1;
              } while (_w - uVar48 != (int)lVar52);
            }
            lVar26 = lVar26 + 0x10;
            lVar34 = lVar34 + 0x10;
            lVar44 = lVar44 + 0x10;
            local_70 = local_70 + 0x10;
            local_78 = local_78 + 0x10;
            local_80 = local_80 + 0x10;
            local_88 = local_88 + 0x10;
            local_90 = local_90 + 0x10;
            local_98 = local_98 + 0x10;
            local_a0 = local_a0 + 0x10;
            lVar52 = local_58 + 0x10;
            uVar38 = local_60 + 0x10;
            lVar24 = local_38 + 0x10;
            lVar27 = local_50 + 0x10;
            lVar28 = local_40 + 0x10;
            lVar29 = local_48 + 0x10;
          } while (local_60 + 0x1f < uVar39);
        }
        if (local_e8.refcount != (int *)0x0) {
          LOCK();
          *local_e8.refcount = *local_e8.refcount + -1;
          UNLOCK();
          if (*local_e8.refcount == 0) {
            if (local_e8.allocator == (Allocator *)0x0) {
              if (local_e8.data != (void *)0x0) {
                free(local_e8.data);
              }
            }
            else {
              (**(code **)(*(long *)local_e8.allocator + 0x18))();
            }
          }
        }
      }
      goto LAB_002bc105;
    }
    Mat::reshape(&local_e8,this_00,_w,uVar48,(Allocator *)0x0);
    uVar43 = uVar48 + 7;
    if (-1 < (int)uVar48) {
      uVar43 = uVar48;
    }
    Mat::create(this_01,_w,(int)uVar43 >> 3,0x20,8,(Allocator *)0x0);
    if (7 < (int)uVar48) {
      local_108 = _w & 0xfffffff0;
      lVar28 = 7;
      lVar52 = 6;
      lVar24 = 5;
      lVar27 = 4;
      local_168 = (void *)0x3;
      local_150 = (void *)0x2;
      local_160 = (void *)0x1;
      local_120 = 0;
      uVar38 = 0;
      do {
        lVar26 = (long)(this->weight_data_tm).w;
        pvVar36 = (this->weight_data_tm).data;
        sVar5 = (this->weight_data_tm).elemsize;
        puVar32 = (undefined4 *)((uVar38 >> 3) * lVar26 * sVar5 + (long)pvVar36);
        lVar29 = (long)local_e8.w;
        if ((int)_w < 0x10) {
          lVar29 = local_e8.elemsize * lVar29;
          lVar45 = lVar29 * uVar38;
          lVar40 = (uVar38 | 1) * lVar29;
          lVar37 = (uVar38 | 2) * lVar29;
          lVar35 = (uVar38 | 3) * lVar29;
          lVar31 = (uVar38 | 4) * lVar29;
          lVar30 = (uVar38 | 5) * lVar29;
          lVar44 = (uVar38 | 6) * lVar29;
          lVar34 = lVar29 * (uVar38 | 7);
          uVar43 = 0;
        }
        else {
          lVar34 = local_e8.elemsize * lVar28 * lVar29;
          lVar44 = local_e8.elemsize * lVar52 * lVar29;
          lVar30 = local_e8.elemsize * lVar24 * lVar29;
          lVar31 = local_e8.elemsize * lVar27 * lVar29;
          lVar35 = local_e8.elemsize * (long)local_168 * lVar29;
          lVar37 = local_e8.elemsize * (long)local_150 * lVar29;
          lVar40 = local_e8.elemsize * (long)local_160 * lVar29;
          lVar29 = local_e8.elemsize * uVar38 * lVar29;
          lVar26 = sVar5 * local_120 * lVar26;
          iVar22 = 0xf;
          lVar45 = 0;
          do {
            auVar68 = *(undefined1 (*) [64])((long)local_e8.data + lVar45 + lVar29);
            auVar69 = *(undefined1 (*) [64])((long)local_e8.data + lVar45 + lVar40);
            auVar70 = *(undefined1 (*) [64])((long)local_e8.data + lVar45 + lVar37);
            auVar71 = *(undefined1 (*) [64])((long)local_e8.data + lVar45 + lVar35);
            auVar72 = *(undefined1 (*) [64])((long)local_e8.data + lVar45 + lVar31);
            auVar73 = *(undefined1 (*) [64])((long)local_e8.data + lVar45 + lVar30);
            auVar74 = *(undefined1 (*) [64])((long)local_e8.data + lVar45 + lVar44);
            auVar75 = *(undefined1 (*) [64])((long)local_e8.data + lVar45 + lVar34);
            auVar76 = vunpcklps_avx512f(auVar68,auVar69);
            auVar68 = vunpckhps_avx512f(auVar68,auVar69);
            auVar69 = vunpcklps_avx512f(auVar70,auVar71);
            auVar70 = vunpckhps_avx512f(auVar70,auVar71);
            auVar71 = vunpcklps_avx512f(auVar72,auVar73);
            auVar72 = vunpckhps_avx512f(auVar72,auVar73);
            auVar73 = vunpcklps_avx512f(auVar74,auVar75);
            auVar74 = vunpckhps_avx512f(auVar74,auVar75);
            auVar75 = vunpcklpd_avx512f(auVar76,auVar69);
            auVar69 = vunpckhpd_avx512f(auVar76,auVar69);
            auVar76 = vunpcklpd_avx512f(auVar68,auVar70);
            auVar68 = vunpckhpd_avx512f(auVar68,auVar70);
            auVar70 = vunpcklpd_avx512f(auVar71,auVar73);
            auVar71 = vunpckhpd_avx512f(auVar71,auVar73);
            auVar73 = vunpcklpd_avx512f(auVar72,auVar74);
            auVar72 = vunpckhpd_avx512f(auVar72,auVar74);
            auVar74 = vshuff64x2_avx512f(auVar75,auVar70,0x88);
            auVar77 = vshuff64x2_avx512f(auVar69,auVar71,0x88);
            auVar78 = vshuff64x2_avx512f(auVar76,auVar73,0x88);
            auVar79 = vshuff64x2_avx512f(auVar68,auVar72,0x88);
            auVar70 = vshuff64x2_avx512f(auVar75,auVar70,0xdd);
            auVar69 = vshuff64x2_avx512f(auVar69,auVar71,0xdd);
            auVar71 = vshuff64x2_avx512f(auVar76,auVar73,0xdd);
            auVar68 = vshuff64x2_avx512f(auVar68,auVar72,0xdd);
            auVar72 = vshuff64x2_avx512f(auVar74,auVar77,0x88);
            auVar73 = vshuff64x2_avx512f(auVar78,auVar79,0x88);
            auVar75 = vshuff64x2_avx512f(auVar70,auVar69,0x88);
            auVar76 = vshuff64x2_avx512f(auVar71,auVar68,0x88);
            auVar74 = vshuff64x2_avx512f(auVar74,auVar77,0xdd);
            auVar77 = vshuff64x2_avx512f(auVar78,auVar79,0xdd);
            auVar69 = vshuff64x2_avx512f(auVar70,auVar69,0xdd);
            auVar68 = vshuff64x2_avx512f(auVar71,auVar68,0xdd);
            *(undefined1 (*) [64])((long)pvVar36 + lVar45 * 8 + lVar26) = auVar72;
            *(undefined1 (*) [64])((long)pvVar36 + lVar45 * 8 + lVar26 + 0x40) = auVar73;
            *(undefined1 (*) [64])((long)pvVar36 + lVar45 * 8 + lVar26 + 0x80) = auVar75;
            *(undefined1 (*) [64])((long)pvVar36 + lVar45 * 8 + lVar26 + 0xc0) = auVar76;
            *(undefined1 (*) [64])((long)pvVar36 + lVar45 * 8 + lVar26 + 0x100) = auVar74;
            *(undefined1 (*) [64])((long)pvVar36 + lVar45 * 8 + lVar26 + 0x140) = auVar77;
            *(undefined1 (*) [64])((long)pvVar36 + lVar45 * 8 + lVar26 + 0x180) = auVar69;
            *(undefined1 (*) [64])((long)pvVar36 + lVar45 * 8 + lVar26 + 0x1c0) = auVar68;
            puVar32 = puVar32 + 0x80;
            iVar22 = iVar22 + 0x10;
            lVar45 = lVar45 + 0x40;
          } while (iVar22 < (int)_w);
          lVar34 = lVar34 + lVar45;
          lVar44 = lVar44 + lVar45;
          lVar30 = lVar30 + lVar45;
          lVar31 = lVar31 + lVar45;
          lVar35 = lVar35 + lVar45;
          lVar37 = lVar37 + lVar45;
          lVar40 = lVar40 + lVar45;
          lVar45 = lVar29 + lVar45;
          uVar43 = local_108;
        }
        local_198 = (void *)((long)local_e8.data + lVar37);
        lVar34 = (long)local_e8.data + lVar34;
        lVar45 = (long)local_e8.data + lVar45;
        lVar35 = (long)local_e8.data + lVar35;
        lVar40 = (long)local_e8.data + lVar40;
        lVar31 = (long)local_e8.data + lVar31;
        lVar30 = (long)local_e8.data + lVar30;
        lVar44 = (long)local_e8.data + lVar44;
        if ((int)(uVar43 | 7) < (int)_w) {
          lVar29 = 0;
          puVar47 = puVar32;
          uVar42 = uVar43;
          do {
            auVar8 = vunpcklps_avx(*(undefined1 (*) [32])(lVar45 + lVar29),
                                   *(undefined1 (*) [32])(lVar40 + lVar29));
            auVar9 = vunpckhps_avx(*(undefined1 (*) [32])(lVar45 + lVar29),
                                   *(undefined1 (*) [32])(lVar40 + lVar29));
            auVar14 = vunpcklps_avx(*(undefined1 (*) [32])((long)local_198 + lVar29),
                                    *(undefined1 (*) [32])(lVar35 + lVar29));
            auVar10 = vunpckhps_avx(*(undefined1 (*) [32])((long)local_198 + lVar29),
                                    *(undefined1 (*) [32])(lVar35 + lVar29));
            auVar18 = vunpcklps_avx(*(undefined1 (*) [32])(lVar31 + lVar29),
                                    *(undefined1 (*) [32])(lVar30 + lVar29));
            auVar11 = vunpckhps_avx(*(undefined1 (*) [32])(lVar31 + lVar29),
                                    *(undefined1 (*) [32])(lVar30 + lVar29));
            auVar66 = vunpcklps_avx(*(undefined1 (*) [32])(lVar44 + lVar29),
                                    *(undefined1 (*) [32])(lVar34 + lVar29));
            auVar12 = vunpckhps_avx(*(undefined1 (*) [32])(lVar44 + lVar29),
                                    *(undefined1 (*) [32])(lVar34 + lVar29));
            auVar13 = vunpcklpd_avx(auVar8,auVar14);
            auVar8 = vunpckhpd_avx(auVar8,auVar14);
            auVar14 = vunpcklpd_avx(auVar9,auVar10);
            auVar9 = vunpckhpd_avx(auVar9,auVar10);
            auVar15 = vunpcklpd_avx(auVar18,auVar66);
            auVar10 = vunpckhpd_avx(auVar18,auVar66);
            auVar18 = vunpcklpd_avx(auVar11,auVar12);
            auVar11 = vunpckhpd_avx(auVar11,auVar12);
            auVar66._16_16_ = auVar15._0_16_;
            auVar66._0_16_ = auVar13._0_16_;
            auVar91._16_16_ = auVar10._0_16_;
            auVar91._0_16_ = auVar8._0_16_;
            auVar92._16_16_ = auVar18._0_16_;
            auVar92._0_16_ = auVar14._0_16_;
            auVar93._16_16_ = auVar11._0_16_;
            auVar93._0_16_ = auVar9._0_16_;
            auVar12 = vperm2f128_avx(auVar13,auVar15,0x31);
            auVar8 = vperm2f128_avx(auVar8,auVar10,0x31);
            auVar10 = vperm2f128_avx(auVar14,auVar18,0x31);
            auVar9 = vperm2f128_avx(auVar9,auVar11,0x31);
            *(undefined1 (*) [32])(puVar32 + lVar29 * 2) = auVar66;
            *(undefined1 (*) [32])(puVar32 + lVar29 * 2 + 8) = auVar91;
            *(undefined1 (*) [32])(puVar32 + lVar29 * 2 + 0x10) = auVar92;
            *(undefined1 (*) [32])(puVar32 + lVar29 * 2 + 0x18) = auVar93;
            *(undefined1 (*) [32])(puVar32 + lVar29 * 2 + 0x20) = auVar12;
            *(undefined1 (*) [32])(puVar32 + lVar29 * 2 + 0x28) = auVar8;
            *(undefined1 (*) [32])(puVar32 + lVar29 * 2 + 0x30) = auVar10;
            *(undefined1 (*) [32])(puVar32 + lVar29 * 2 + 0x38) = auVar9;
            puVar47 = puVar47 + 0x40;
            uVar43 = uVar42 + 8;
            iVar22 = uVar42 + 0xf;
            lVar29 = lVar29 + 0x20;
            uVar42 = uVar43;
          } while (iVar22 < (int)_w);
          lVar34 = lVar34 + lVar29;
          lVar44 = lVar44 + lVar29;
          lVar30 = lVar30 + lVar29;
          lVar31 = lVar31 + lVar29;
          lVar35 = lVar35 + lVar29;
          local_198 = (void *)((long)local_198 + lVar29);
          lVar40 = lVar40 + lVar29;
          lVar45 = lVar45 + lVar29;
          puVar32 = puVar47;
        }
        if ((int)uVar43 < (int)_w) {
          lVar29 = 0;
          do {
            *puVar32 = *(undefined4 *)(lVar45 + lVar29 * 4);
            puVar32[1] = *(undefined4 *)(lVar40 + lVar29 * 4);
            puVar32[2] = *(undefined4 *)((long)local_198 + lVar29 * 4);
            puVar32[3] = *(undefined4 *)(lVar35 + lVar29 * 4);
            puVar32[4] = *(undefined4 *)(lVar31 + lVar29 * 4);
            puVar32[5] = *(undefined4 *)(lVar30 + lVar29 * 4);
            puVar32[6] = *(undefined4 *)(lVar44 + lVar29 * 4);
            puVar32[7] = *(undefined4 *)(lVar34 + lVar29 * 4);
            puVar32 = puVar32 + 8;
            lVar29 = lVar29 + 1;
          } while (_w - uVar43 != (int)lVar29);
        }
        uVar33 = uVar38 + 0xf;
        lVar28 = lVar28 + 8;
        lVar52 = lVar52 + 8;
        lVar24 = lVar24 + 8;
        lVar27 = lVar27 + 8;
        local_168 = (void *)((long)local_168 + 8);
        local_150 = (void *)((long)local_150 + 8);
        local_160 = (void *)((long)local_160 + 8);
        local_120 = local_120 + 1;
        uVar38 = uVar38 + 8;
      } while (uVar33 < uVar39);
    }
    if (local_e8.refcount != (int *)0x0) {
      LOCK();
      *local_e8.refcount = *local_e8.refcount + -1;
      UNLOCK();
      if (*local_e8.refcount == 0) {
        if (local_e8.allocator == (Allocator *)0x0) {
          if (local_e8.data != (void *)0x0) {
            free(local_e8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_e8.allocator + 0x18))();
        }
      }
    }
  }
  if (bVar25 == 1) {
    piVar6 = (this->super_InnerProduct).weight_data.refcount;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + 1;
      UNLOCK();
    }
    piVar6 = (this->weight_data_tm).refcount;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        pvVar36 = (this->weight_data_tm).data;
        pAVar7 = (this->weight_data_tm).allocator;
        if (pAVar7 == (Allocator *)0x0) {
          if (pvVar36 != (void *)0x0) {
            free(pvVar36);
          }
        }
        else {
          (**(code **)(*(long *)pAVar7 + 0x18))();
        }
      }
    }
    (this->weight_data_tm).cstep = 0;
    *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
    *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
    this_01->data = (void *)0x0;
    (this->weight_data_tm).refcount = (int *)0x0;
    piVar6 = (this->super_InnerProduct).weight_data.refcount;
    (this->weight_data_tm).data = (this->super_InnerProduct).weight_data.data;
    (this->weight_data_tm).refcount = piVar6;
    (this->weight_data_tm).elemsize = (this->super_InnerProduct).weight_data.elemsize;
    (this->weight_data_tm).elempack = (this->super_InnerProduct).weight_data.elempack;
    (this->weight_data_tm).allocator = (this->super_InnerProduct).weight_data.allocator;
    iVar22 = (this->super_InnerProduct).weight_data.w;
    iVar20 = (this->super_InnerProduct).weight_data.h;
    iVar21 = (this->super_InnerProduct).weight_data.d;
    (this->weight_data_tm).dims = (this->super_InnerProduct).weight_data.dims;
    (this->weight_data_tm).w = iVar22;
    (this->weight_data_tm).h = iVar20;
    (this->weight_data_tm).d = iVar21;
    (this->weight_data_tm).c = (this->super_InnerProduct).weight_data.c;
    (this->weight_data_tm).cstep = (this->super_InnerProduct).weight_data.cstep;
  }
  else if (bVar25 == 4) {
    Mat::reshape(&local_e8,this_00,_w,uVar48,(Allocator *)0x0);
    uVar43 = uVar48 + 3;
    if (-1 < (int)uVar48) {
      uVar43 = uVar48;
    }
    Mat::create(this_01,_w,(int)uVar43 >> 2,0x10,4,(Allocator *)0x0);
    if (3 < (int)uVar48) {
      local_168._0_4_ = _w & 0xfffffffc;
      lVar52 = 3;
      lVar27 = 2;
      lVar24 = 1;
      local_198 = (void *)0x0;
      uVar38 = 0;
      do {
        lVar29 = (long)(this->weight_data_tm).w;
        pvVar36 = (this->weight_data_tm).data;
        sVar5 = (this->weight_data_tm).elemsize;
        puVar32 = (undefined4 *)((uVar38 >> 2) * lVar29 * sVar5 + (long)pvVar36);
        lVar28 = (long)local_e8.w;
        if ((int)_w < 4) {
          lVar28 = local_e8.elemsize * lVar28;
          lVar30 = lVar28 * uVar38;
          lVar44 = (uVar38 | 1) * lVar28;
          lVar34 = (uVar38 | 2) * lVar28;
          lVar26 = lVar28 * (uVar38 | 3);
          uVar48 = 0;
        }
        else {
          lVar26 = local_e8.elemsize * lVar52 * lVar28;
          lVar34 = local_e8.elemsize * lVar27 * lVar28;
          lVar44 = local_e8.elemsize * lVar24 * lVar28;
          lVar28 = local_e8.elemsize * uVar38 * lVar28;
          iVar22 = 3;
          lVar30 = 0;
          do {
            puVar47 = puVar32;
            auVar1 = *(undefined1 (*) [16])((long)local_e8.data + lVar30 + lVar28);
            auVar2 = *(undefined1 (*) [16])((long)local_e8.data + lVar30 + lVar44);
            auVar3 = *(undefined1 (*) [16])((long)local_e8.data + lVar30 + lVar34);
            auVar4 = *(undefined1 (*) [16])((long)local_e8.data + lVar30 + lVar26);
            auVar16 = vunpcklps_avx(auVar1,auVar2);
            auVar17 = vunpcklps_avx(auVar3,auVar4);
            auVar2 = vunpckhps_avx(auVar1,auVar2);
            auVar3 = vunpckhps_avx(auVar3,auVar4);
            auVar4 = vunpcklpd_avx(auVar16,auVar17);
            auVar1 = vunpckhpd_avx(auVar16,auVar17);
            auVar16 = vunpcklpd_avx(auVar2,auVar3);
            auVar2 = vunpckhpd_avx(auVar2,auVar3);
            puVar32 = (undefined4 *)
                      ((long)pvVar36 + lVar30 * 4 + sVar5 * (long)local_198 * lVar29 + 0x40);
            *(undefined1 (*) [16])(puVar32 + -0x10) = auVar4;
            *(undefined1 (*) [16])(puVar32 + -0xc) = auVar1;
            *(undefined1 (*) [16])(puVar32 + -8) = auVar16;
            *(undefined1 (*) [16])(puVar32 + -4) = auVar2;
            iVar22 = iVar22 + 4;
            lVar30 = lVar30 + 0x10;
          } while (iVar22 < (int)_w);
          puVar32 = puVar47 + 0x10;
          lVar26 = lVar26 + lVar30;
          lVar34 = lVar34 + lVar30;
          lVar44 = lVar44 + lVar30;
          lVar30 = lVar28 + lVar30;
          uVar48 = (uint)local_168;
        }
        if ((int)uVar48 < (int)_w) {
          lVar28 = 0;
          do {
            *puVar32 = *(undefined4 *)((long)local_e8.data + lVar28 * 4 + lVar30);
            puVar32[1] = *(undefined4 *)((long)local_e8.data + lVar28 * 4 + lVar44);
            puVar32[2] = *(undefined4 *)((long)local_e8.data + lVar28 * 4 + lVar34);
            puVar32[3] = *(undefined4 *)((long)local_e8.data + lVar28 * 4 + lVar26);
            puVar32 = puVar32 + 4;
            lVar28 = lVar28 + 1;
          } while (_w - uVar48 != (int)lVar28);
        }
        uVar33 = uVar38 + 7;
        lVar52 = lVar52 + 4;
        lVar27 = lVar27 + 4;
        lVar24 = lVar24 + 4;
        local_198 = (void *)((long)local_198 + 1);
        uVar38 = uVar38 + 4;
      } while (uVar33 < uVar39);
    }
    if (local_e8.refcount != (int *)0x0) {
      LOCK();
      *local_e8.refcount = *local_e8.refcount + -1;
      UNLOCK();
      if (*local_e8.refcount == 0) {
        if (local_e8.allocator == (Allocator *)0x0) {
          if (local_e8.data != (void *)0x0) {
            free(local_e8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_e8.allocator + 0x18))();
        }
      }
    }
  }
LAB_002bc105:
  if (opt->lightmode == true) {
    piVar6 = (this->super_InnerProduct).weight_data.refcount;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        pvVar36 = (this->super_InnerProduct).weight_data.data;
        pAVar7 = (this->super_InnerProduct).weight_data.allocator;
        if (pAVar7 == (Allocator *)0x0) {
          if (pvVar36 != (void *)0x0) {
            free(pvVar36);
          }
        }
        else {
          (**(code **)(*(long *)pAVar7 + 0x18))();
        }
      }
    }
    (this->super_InnerProduct).weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_InnerProduct).weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_InnerProduct).weight_data.elemsize + 4) = 0;
    this_00->data = (void *)0x0;
    (this->super_InnerProduct).weight_data.refcount = (int *)0x0;
    (this->super_InnerProduct).weight_data.dims = 0;
    (this->super_InnerProduct).weight_data.w = 0;
    (this->super_InnerProduct).weight_data.h = 0;
    (this->super_InnerProduct).weight_data.d = 0;
    (this->super_InnerProduct).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int InnerProduct_x86_avx512::create_pipeline(const Option& opt)
{
    //     if (opt.use_packing_layout)
    {
        flatten = ncnn::create_layer_cpu(ncnn::LayerType::Flatten);

        ncnn::ParamDict pd;

        flatten->load_param(pd);

        flatten->create_pipeline(opt);
    }

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return create_pipeline_fp16s(opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    innerproduct_transform_kernel_sse(weight_data, weight_data_tm, num_input, num_output, opt);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}